

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MahonyAHRS.c
# Opt level: O3

double invSqrt(double x)

{
  double dVar1;
  double y;
  
  dVar1 = (double)(0x5f3759df - ((long)x >> 1));
  return (x * -0.5 * dVar1 * dVar1 + 1.5) * dVar1;
}

Assistant:

double invSqrt(double x) {
    double halfx = 0.5f * x;
    double y = x;
    long i = *(long*)&y;
    i = 0x5f3759df - (i>>1);
    y = *(double*)&i;
    y = y * (1.5f - (halfx * y * y));
    return y;
}